

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O3

enable_if_t<_std::is_class<typename_std::decay_t<const_float_&>_>::value,_void>
pbrt::detail::stringPrintfRecursiveWithPrecision<float_const&>
          (string *s,char *fmt,string *nextFmt,int precision,float *v)

{
  int iVar1;
  undefined4 in_register_0000000c;
  string str;
  char *local_58;
  undefined8 local_50;
  char local_48;
  undefined7 uStack_47;
  char *local_38;
  
  local_38 = fmt;
  iVar1 = snprintf((char *)0x0,0,(nextFmt->_M_dataplus)._M_p,(double)*v,
                   CONCAT44(in_register_0000000c,precision));
  local_58 = &local_48;
  local_50 = 0;
  local_48 = '\0';
  std::__cxx11::string::resize((ulong)&local_58,(char)(iVar1 + 1));
  snprintf(local_58,(long)(iVar1 + 1),(nextFmt->_M_dataplus)._M_p,(double)*v,(ulong)(uint)precision)
  ;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::_M_append((char *)s,(ulong)local_58);
  stringPrintfRecursive(s,local_38);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

inline typename std::enable_if_t<!std::is_class<typename std::decay_t<T>>::value, void>
stringPrintfRecursiveWithPrecision(std::string *s, const char *fmt,
                                   const std::string &nextFmt, int precision, T &&v,
                                   Args &&... args) {
    size_t size = snprintf(nullptr, 0, nextFmt.c_str(), precision, v) + 1;
    std::string str;
    str.resize(size);
    snprintf(&str[0], size, nextFmt.c_str(), precision, v);
    str.pop_back();  // remove trailing NUL
    *s += str;

    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}